

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O3

void __thiscall
llm_build_dbrx::llm_build_dbrx
          (llm_build_dbrx *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *plVar2;
  ggml_context *pgVar3;
  pointer plVar4;
  uint32_t uVar5;
  ggml_tensor *pgVar6;
  llm_graph_input_attn_kv_unified *inp;
  ulong uVar7;
  ggml_tensor *pgVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ggml_tensor *pgVar12;
  ggml_tensor *cur;
  char *pcVar13;
  int il;
  long lVar14;
  long lVar15;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar16;
  ggml_tensor *local_68;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar2 = (this->super_llm_graph_context).hparams;
  uVar1 = plVar2->n_embd_head_v;
  uVar5 = llama_hparams::n_embd_v_gqa(plVar2,0);
  plVar2 = (this->super_llm_graph_context).hparams;
  if (uVar1 == plVar2->n_embd_head_k) {
    if (uVar1 == plVar2->n_rot) {
      local_68 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
      pgVar6 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
      inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
      if (0 < (this->super_llm_graph_context).n_layer) {
        uVar7 = (ulong)uVar5;
        lVar15 = 0;
        lVar14 = 0;
        do {
          uVar16 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
          il = (int)lVar14;
          pgVar8 = llm_graph_context::build_norm
                             (&this->super_llm_graph_context,local_68,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->attn_norm +
                               lVar15),(ggml_tensor *)0x0,LLM_NORM,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"attn_norm",il);
          pgVar8 = llm_graph_context::build_lora_mm
                             (&this->super_llm_graph_context,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->wqkv + lVar15),
                              pgVar8);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"wqkv",il);
          pgVar8 = (ggml_tensor *)
                   ggml_clamp(-((this->super_llm_graph_context).hparams)->f_clamp_kqv,
                              (this->super_llm_graph_context).ctx0,pgVar8);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"wqkv_clamped",il);
          pgVar3 = (this->super_llm_graph_context).ctx0;
          uVar9 = ggml_view_2d(pgVar3,pgVar8,(this->super_llm_graph_context).n_embd,
                               (long)(this->super_llm_graph_context).n_tokens,pgVar8->nb[1],0);
          uVar9 = ggml_cont(pgVar3,uVar9);
          pgVar3 = (this->super_llm_graph_context).ctx0;
          uVar10 = ggml_view_2d(pgVar3,pgVar8,uVar7,(long)(this->super_llm_graph_context).n_tokens,
                                pgVar8->nb[1],(this->super_llm_graph_context).n_embd << 2);
          uVar10 = ggml_cont(pgVar3,uVar10);
          pgVar3 = (this->super_llm_graph_context).ctx0;
          uVar11 = ggml_view_2d(pgVar3,pgVar8,uVar7,(long)(this->super_llm_graph_context).n_tokens,
                                pgVar8->nb[1],((this->super_llm_graph_context).n_embd + uVar7) * 4);
          uVar11 = ggml_cont(pgVar3,uVar11);
          uVar9 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar9,uVar1,
                                  (this->super_llm_graph_context).n_head,
                                  (long)(this->super_llm_graph_context).n_tokens);
          uVar10 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar10,uVar1,
                                   (this->super_llm_graph_context).n_head_kv,
                                   (long)(this->super_llm_graph_context).n_tokens);
          pgVar8 = (ggml_tensor *)
                   ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar11,uVar1,
                                   (this->super_llm_graph_context).n_head_kv,
                                   (long)(this->super_llm_graph_context).n_tokens);
          pgVar12 = (ggml_tensor *)
                    ggml_rope_ext((this->super_llm_graph_context).freq_base,
                                  (this->super_llm_graph_context).freq_scale,
                                  (this->super_llm_graph_context).ext_factor,
                                  (this->super_llm_graph_context).attn_factor,
                                  (this->super_llm_graph_context).beta_fast,
                                  (this->super_llm_graph_context).beta_slow,
                                  (this->super_llm_graph_context).ctx0,uVar9,pgVar6,0,
                                  (int)(this->super_llm_graph_context).n_rot,
                                  (this->super_llm_graph_context).rope_type,
                                  CONCAT44(uVar16,(this->super_llm_graph_context).n_ctx_orig));
          cur = (ggml_tensor *)
                ggml_rope_ext((this->super_llm_graph_context).freq_base,
                              (this->super_llm_graph_context).freq_scale,
                              (this->super_llm_graph_context).ext_factor,
                              (this->super_llm_graph_context).attn_factor,
                              (this->super_llm_graph_context).beta_fast,
                              (this->super_llm_graph_context).beta_slow,
                              (this->super_llm_graph_context).ctx0,uVar10,pgVar6,0,
                              (int)(this->super_llm_graph_context).n_rot,
                              (this->super_llm_graph_context).rope_type,
                              (this->super_llm_graph_context).n_ctx_orig);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"Qcur",il);
          llm_graph_context::cb(&this->super_llm_graph_context,cur,"Kcur",il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Vcur",il);
          pgVar8 = llm_graph_context::build_attn
                             (&this->super_llm_graph_context,inp,gf,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->wo + lVar15),
                              (ggml_tensor *)0x0,pgVar12,cur,pgVar8,(ggml_tensor *)0x0,
                              (ggml_tensor *)0x0,1.0 / SQRT((float)uVar1),il);
          if (lVar14 == (this->super_llm_graph_context).n_layer + -1) {
            pgVar12 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
            pgVar8 = (ggml_tensor *)
                     ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar8,pgVar12);
            local_68 = (ggml_tensor *)
                       ggml_get_rows((this->super_llm_graph_context).ctx0,local_68,pgVar12);
          }
          pgVar8 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar8,local_68);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_inp",il);
          pgVar12 = llm_graph_context::build_norm
                              (&this->super_llm_graph_context,pgVar8,
                               *(ggml_tensor **)
                                ((long)&((model->layers).
                                         super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->attn_out_norm +
                                lVar15),(ggml_tensor *)0x0,LLM_NORM,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"attn_out_norm",il);
          plVar4 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          in_stack_ffffffffffffff48 = 0;
          pgVar12 = llm_graph_context::build_moe_ffn
                              (&this->super_llm_graph_context,pgVar12,
                               *(ggml_tensor **)((long)&plVar4->ffn_gate_inp + lVar15),
                               *(ggml_tensor **)((long)&plVar4->ffn_up_exps + lVar15),
                               *(ggml_tensor **)((long)&plVar4->ffn_gate_exps + lVar15),
                               *(ggml_tensor **)((long)&plVar4->ffn_down_exps + lVar15),
                               (ggml_tensor *)0x0,(this->super_llm_graph_context).n_expert,
                               (this->super_llm_graph_context).n_expert_used,LLM_FFN_SILU,true,false
                               ,0.0,LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"ffn_moe_out",il);
          pgVar8 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar12,pgVar8);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_out",il);
          local_68 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar8,il);
          llm_graph_context::cb(&this->super_llm_graph_context,local_68,"l_out",il);
          lVar14 = lVar14 + 1;
          lVar15 = lVar15 + 0x4f0;
        } while (lVar14 < (this->super_llm_graph_context).n_layer);
      }
      pgVar6 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_68,model->output_norm,
                          (ggml_tensor *)0x0,LLM_NORM,-1);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"result_norm",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar6;
      pgVar6 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar6)
      ;
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"result_output",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar6;
      ggml_build_forward_expand(gf,pgVar6);
      return;
    }
    pcVar13 = "n_embd_head == hparams.n_rot";
    uVar9 = 0x14d6;
  }
  else {
    pcVar13 = "n_embd_head == hparams.n_embd_head_k";
    uVar9 = 0x14d5;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,uVar9,"GGML_ASSERT(%s) failed",pcVar13);
}

Assistant:

llm_build_dbrx(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                ggml_tensor * Qcur = nullptr;
                ggml_tensor * Kcur = nullptr;
                ggml_tensor * Vcur = nullptr;

                cur = build_lora_mm(model.layers[il].wqkv, cur);
                cb(cur, "wqkv", il);

                cur = ggml_clamp(ctx0, cur, -hparams.f_clamp_kqv, hparams.f_clamp_kqv);
                cb(cur, "wqkv_clamped", il);

                Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd + n_embd_gqa)));

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            // MoE branch
            cur = build_norm(ffn_inp,
                    model.layers[il].attn_out_norm, NULL,
                    LLM_NORM, il);
            cb(cur, "attn_out_norm", il);

            cur = build_moe_ffn(cur,
                    model.layers[il].ffn_gate_inp,
                    model.layers[il].ffn_up_exps,
                    model.layers[il].ffn_gate_exps,
                    model.layers[il].ffn_down_exps,
                    nullptr,
                    n_expert, n_expert_used,
                    LLM_FFN_SILU, true,
                    false, 0.0,
                    LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,
                    il);
            cb(cur, "ffn_moe_out", il);

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "ffn_out", il);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }